

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O0

rtr_secure_path_seg * rtr_bgpsec_new_secure_path_seg(uint8_t pcount,uint8_t flags,uint32_t asn)

{
  long lVar1;
  rtr_secure_path_seg *prVar2;
  long in_FS_OFFSET;
  rtr_secure_path_seg *seg;
  uint32_t asn_local;
  uint8_t flags_local;
  uint8_t pcount_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prVar2 = (rtr_secure_path_seg *)lrtr_malloc(0x10);
  prVar2->pcount = pcount;
  prVar2->flags = flags;
  prVar2->asn = asn;
  prVar2->next = (rtr_secure_path_seg *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return prVar2;
  }
  __stack_chk_fail();
}

Assistant:

struct rtr_secure_path_seg *rtr_bgpsec_new_secure_path_seg(uint8_t pcount, uint8_t flags, uint32_t asn)
{
	struct rtr_secure_path_seg *seg = lrtr_malloc(sizeof(struct rtr_secure_path_seg));

	seg->pcount = pcount;
	seg->flags = flags;
	seg->asn = asn;
	seg->next = NULL;
	return seg;
}